

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

void LiteScript::StateExecutor::I_OP_MEMBER(State *state,Instruction *instr)

{
  pointer pVVar1;
  Variable result;
  Variable v1;
  Variable local_30;
  Variable local_20;
  
  state->line_num = state->line_num + 1;
  pVVar1 = (state->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pVVar1 != (state->op_lifo).
                 super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                 _M_impl.super__Vector_impl_data._M_start) && (instr->comp_type == '\x04')) {
    Variable::Variable(&local_20,pVVar1 + -1);
    PopValue(state);
    Variable::GetMember(&local_30,(char *)&local_20);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
              (&state->op_lifo,&local_30);
    Variable::~Variable(&local_30);
    Variable::~Variable(&local_20);
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_OP_MEMBER(State& state, Instruction& instr) {
    state.line_num++;
    if (state.op_lifo.size() < 1 || instr.comp_type != Instruction::CompType::COMP_TYPE_STRING)
        return;
    Variable v1(state.op_lifo.back());
    PopValue(state);
    Variable result = v1.GetMember(instr.comp_value.v_string);
    state.op_lifo.push_back(result);
}